

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O0

ByteData * cfd::core::HashUtil::Sha512(ByteData *__return_storage_ptr__,Script *script)

{
  ByteData local_30;
  Script *local_18;
  Script *script_local;
  
  local_18 = script;
  script_local = (Script *)__return_storage_ptr__;
  Script::GetData(&local_30,script);
  Sha512(__return_storage_ptr__,&local_30);
  ByteData::~ByteData(&local_30);
  return __return_storage_ptr__;
}

Assistant:

ByteData HashUtil::Sha512(const Script &script) {
  return Sha512(script.GetData());
}